

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
          (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this)

{
  iterator S;
  iterator E;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this_local;
  
  S = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
  E = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range(S,E);
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }